

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O3

ParseResult __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
Parse<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  Ch *pCVar1;
  byte *pbVar2;
  ulong uVar3;
  byte *pbVar4;
  ParseResult PVar5;
  
  *(undefined4 *)(this + 0x30) = 0;
  *(undefined8 *)(this + 0x38) = 0;
  pbVar2 = (byte *)is->src_;
  pbVar4 = pbVar2;
  while (((ulong)*pbVar4 < 0x21 && ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
    pbVar4 = pbVar4 + 1;
    pbVar2 = pbVar2 + 1;
  }
  is->src_ = (Ch *)pbVar4;
  if (*pbVar4 == 0) {
    pCVar1 = is->head_;
    *(undefined4 *)(this + 0x30) = 1;
    *(long *)(this + 0x38) = (long)pbVar2 - (long)pCVar1;
    uVar3 = 1;
  }
  else {
    ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    uVar3 = (ulong)*(uint *)(this + 0x30);
    if (*(uint *)(this + 0x30) == 0) {
      pbVar2 = (byte *)is->src_;
      pbVar4 = pbVar2;
      while (((ulong)*pbVar4 < 0x21 && ((0x100002600U >> ((ulong)*pbVar4 & 0x3f) & 1) != 0))) {
        pbVar4 = pbVar4 + 1;
        pbVar2 = pbVar2 + 1;
      }
      is->src_ = (Ch *)pbVar4;
      if (*pbVar4 == 0) {
        uVar3 = (ulong)*(uint *)(this + 0x30);
      }
      else {
        pCVar1 = is->head_;
        *(undefined4 *)(this + 0x30) = 2;
        *(long *)(this + 0x38) = (long)pbVar2 - (long)pCVar1;
        uVar3 = 2;
      }
    }
  }
  *(undefined8 *)(this + 0x18) = *(undefined8 *)(this + 0x10);
  PVar5.offset_ = *(size_t *)(this + 0x38);
  PVar5._0_8_ = uVar3;
  return PVar5;
}

Assistant:

ParseResult Parse(InputStream& is, Handler& handler) {
        if (parseFlags & kParseIterativeFlag)
            return IterativeParse<parseFlags>(is, handler);

        parseResult_.Clear();

        ClearStackOnExit scope(*this);

        SkipWhitespaceAndComments<parseFlags>(is);
        RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

        if (RAPIDJSON_UNLIKELY(is.Peek() == '\0')) {
            RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentEmpty, is.Tell());
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
        }
        else {
            ParseValue<parseFlags>(is, handler);
            RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

            if (!(parseFlags & kParseStopWhenDoneFlag)) {
                SkipWhitespaceAndComments<parseFlags>(is);
                RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);

                if (RAPIDJSON_UNLIKELY(is.Peek() != '\0')) {
                    RAPIDJSON_PARSE_ERROR_NORETURN(kParseErrorDocumentRootNotSingular, is.Tell());
                    RAPIDJSON_PARSE_ERROR_EARLY_RETURN(parseResult_);
                }
            }
        }

        return parseResult_;
    }